

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

dir_tree_t * add_dirs(char **argv)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  file_entry_t *pfVar4;
  dir_tree_t *unaff_R12;
  dir_tree_t *pdVar5;
  
  lVar1 = fts_open(argv,2,0);
  if (lVar1 == 0) {
    add_dirs_cold_1();
    pdVar5 = (dir_tree_t *)0x0;
  }
  else {
    lVar2 = fts_read(lVar1);
    if (lVar2 == 0) {
      pdVar5 = (dir_tree_t *)0x0;
    }
    else {
      pdVar5 = (dir_tree_t *)0x0;
      do {
        if ((*(short *)(lVar2 + 0x62) == 1) && (*(char *)(lVar2 + 0x70) == '.')) {
          fts_set(lVar1,lVar2,4);
        }
        if ((*(short *)(lVar2 + 0x62) == 1) && (*(short *)(lVar2 + 0x60) == 0)) {
          unaff_R12 = alloc_dir_tree(*(char **)(lVar2 + 0x30));
          if (unaff_R12 != (dir_tree_t *)0x0) {
            unaff_R12->next = pdVar5;
            pdVar5 = unaff_R12;
            goto LAB_001037fa;
          }
LAB_00103854:
          no_mem = 1;
          break;
        }
LAB_001037fa:
        if ((*(short *)(lVar2 + 0x62) == 8) &&
           (sVar3 = strlen((char *)(lVar2 + 0x70)), *(char *)(sVar3 + 0x6f + lVar2) != '~')) {
          pfVar4 = alloc_file_entry("",*(char **)(lVar2 + 0x30),
                                    *(time_t *)(*(long *)(lVar2 + 0x68) + 0x58));
          if (pfVar4 == (file_entry_t *)0x0) goto LAB_00103854;
          pfVar4->next = unaff_R12->files;
          unaff_R12->files = pfVar4;
        }
        lVar2 = fts_read(lVar1);
      } while (lVar2 != 0);
    }
    fts_close(lVar1);
  }
  return pdVar5;
}

Assistant:

dir_tree_t *add_dirs(char **argv)
{
	FTS *fts;
	FTSENT *ent;
	dir_tree_t *tree, *trees = NULL;
	file_entry_t *file;

	fts = fts_open(argv, FTS_LOGICAL, NULL);
	if (fts == NULL)
	{
		fprintf(stderr, "Failed to start directory traversal: %s\n", strerror(errno));
		return NULL;
	}
	while ((ent = fts_read(fts)) != NULL)
	{
		if (ent->fts_info == FTS_D && ent->fts_name[0] == '.')
		{
			// Skip hidden directories. (Prevents SVN bookkeeping
			// info from being included.)
			// [BL] Also skip backup files.
			fts_set(fts, ent, FTS_SKIP);
		}
		if (ent->fts_info == FTS_D && ent->fts_level == 0)
		{
			tree = alloc_dir_tree(ent->fts_path);
			if (tree == NULL)
			{
				no_mem = 1;
				break;
			}
			tree->next = trees;
			trees = tree;
		}
		if (ent->fts_info != FTS_F)
		{
			// We're only interested in remembering files.
			continue;
		}
		else if(ent->fts_name[strlen(ent->fts_name)-1] == '~')
		{
			// Don't remember backup files.
			continue;
		}
		file = alloc_file_entry("", ent->fts_path, ent->fts_statp->st_mtime);
		if (file == NULL)
		{
			no_mem = 1;
			break;
		}
		file->next = tree->files;
		tree->files = file;
	}
	fts_close(fts);
	return trees;
}